

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glew.c
# Opt level: O0

GLboolean glxewGetExtension(char *name)

{
  GLuint GVar1;
  Display *pDVar2;
  GLubyte *s;
  GLubyte *end;
  GLubyte *start;
  char *name_local;
  
  if (__glewXGetCurrentDisplay == (PFNGLXGETCURRENTDISPLAYPROC)0x0) {
    name_local._7_1_ = '\0';
  }
  else {
    pDVar2 = (*__glewXGetCurrentDisplay)();
    s = (GLubyte *)glXGetClientString(pDVar2,3);
    if (s == (GLubyte *)0x0) {
      name_local._7_1_ = '\0';
    }
    else {
      GVar1 = _glewStrLen(s);
      name_local._7_1_ = _glewSearchExtension(name,s,s + GVar1);
    }
  }
  return name_local._7_1_;
}

Assistant:

GLboolean glxewGetExtension (const char* name)
{    
  const GLubyte* start;
  const GLubyte* end;

  if (glXGetCurrentDisplay == NULL) return GL_FALSE;
  start = (const GLubyte*)glXGetClientString(glXGetCurrentDisplay(), GLX_EXTENSIONS);
  if (0 == start) return GL_FALSE;
  end = start + _glewStrLen(start);
  return _glewSearchExtension(name, start, end);
}